

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NVT.cpp
# Opt level: O2

void __thiscall OpenMD::NVT::moveB(NVT *this)

{
  Molecule *pMVar1;
  ulong uVar2;
  long lVar3;
  Vector<double,_3U> *pVVar4;
  long lVar5;
  StuntDouble *pSVar6;
  pointer ppSVar7;
  RealType RVar8;
  double dVar9;
  pair<double,_double> thermostat;
  MoleculeIterator i;
  Vector3d frc;
  Vector3d vel;
  Vector3d ji;
  Vector3d Tb;
  pair<double,_double> local_158;
  long local_148;
  MoleculeIterator local_140;
  Thermo *local_138;
  double local_130;
  ulong local_128;
  Molecule *local_120;
  pointer local_118;
  long local_110;
  Vector<double,_3U> local_108;
  Vector<double,_3U> local_f0;
  double local_d8;
  undefined8 uStack_d0;
  Vector<double,_3U> local_c0;
  Vector<double,_3U> local_a8;
  Vector<double,_3U> local_90;
  Vector<double,_3U> local_78;
  Vector<double,_3U> local_60;
  Vector<double,_3U> local_48;
  
  local_140._M_node = (_Base_ptr)0x0;
  Vector<double,_3U>::Vector(&local_48);
  Vector<double,_3U>::Vector(&local_60);
  Vector<double,_3U>::Vector(&local_78);
  Vector<double,_3U>::Vector(&local_90);
  local_158 = Snapshot::getThermostat((this->super_VelocityVerletIntegrator).super_Integrator.snap);
  local_130 = local_158.first;
  pMVar1 = SimInfo::beginMolecule
                     ((this->super_VelocityVerletIntegrator).super_Integrator.info_,&local_140);
  lVar3 = 0;
  while (pMVar1 != (Molecule *)0x0) {
    ppSVar7 = (pMVar1->integrableObjects_).
              super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    if (ppSVar7 ==
        (pMVar1->integrableObjects_).
        super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      pSVar6 = (StuntDouble *)0x0;
    }
    else {
      pSVar6 = *ppSVar7;
    }
    lVar3 = (long)(int)lVar3;
    lVar5 = lVar3 * 0x18;
    while (ppSVar7 = ppSVar7 + 1, pSVar6 != (StuntDouble *)0x0) {
      StuntDouble::getVel((Vector3d *)&local_108,pSVar6);
      Vector<double,_3U>::operator=
                ((Vector<double,_3U> *)
                 ((long)(((this->oldVel_).
                          super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->super_Vector<double,_3U>).
                        data_ + lVar5),&local_108);
      if (pSVar6->objType_ - otDAtom < 2) {
        StuntDouble::getJ((Vector3d *)&local_108,pSVar6);
        Vector<double,_3U>::operator=
                  ((Vector<double,_3U> *)
                   ((long)(((this->oldJi_).
                            super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->super_Vector<double,_3U>).
                          data_ + lVar5),&local_108);
      }
      if (ppSVar7 ==
          (pMVar1->integrableObjects_).
          super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        pSVar6 = (StuntDouble *)0x0;
      }
      else {
        pSVar6 = *ppSVar7;
      }
      lVar5 = lVar5 + 0x18;
      lVar3 = lVar3 + 1;
    }
    pMVar1 = SimInfo::nextMolecule
                       ((this->super_VelocityVerletIntegrator).super_Integrator.info_,&local_140);
  }
  local_138 = &(this->super_VelocityVerletIntegrator).super_Integrator.thermo;
  uVar2 = 0;
  do {
    if (this->maxIterNum_ <= (int)uVar2) {
      dVar9 = local_158.first;
      break;
    }
    local_128 = uVar2;
    RVar8 = Thermo::getTemperature(local_138);
    local_d8 = local_158.first;
    uStack_d0 = 0;
    local_158.first =
         ((RVar8 / this->targetTemp_ + -1.0) *
         (this->super_VelocityVerletIntegrator).super_Integrator.dt2) /
         (this->tauThermostat_ * this->tauThermostat_) + local_130;
    pMVar1 = SimInfo::beginMolecule
                       ((this->super_VelocityVerletIntegrator).super_Integrator.info_,&local_140);
    lVar3 = 0;
    while (pMVar1 != (Molecule *)0x0) {
      ppSVar7 = (pMVar1->integrableObjects_).
                super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
      if (ppSVar7 ==
          (pMVar1->integrableObjects_).
          super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        pSVar6 = (StuntDouble *)0x0;
      }
      else {
        pSVar6 = *ppSVar7;
      }
      lVar3 = (long)(int)lVar3;
      local_148 = lVar3 * 0x18;
      local_120 = pMVar1;
      while (pSVar6 != (StuntDouble *)0x0) {
        local_118 = ppSVar7 + 1;
        local_110 = lVar3;
        StuntDouble::getFrc((Vector3d *)&local_108,pSVar6);
        Vector<double,_3U>::operator=(&local_90,&local_108);
        lVar3 = local_148;
        pVVar4 = (Vector<double,_3U> *)
                 ((long)(((this->oldVel_).
                          super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->super_Vector<double,_3U>).
                        data_ + local_148);
        operator*(&local_a8,
                  ((this->super_VelocityVerletIntegrator).super_Integrator.dt2 / pSVar6->mass_) *
                  0.0004184,&local_90);
        OpenMD::operator+(&local_f0,pVVar4,&local_a8);
        operator*(&local_c0,
                  (this->super_VelocityVerletIntegrator).super_Integrator.dt2 * local_158.first,
                  (Vector<double,_3U> *)
                  ((long)(((this->oldVel_).
                           super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->super_Vector<double,_3U>).
                         data_ + lVar3));
        operator-(&local_108,&local_f0,&local_c0);
        Vector3<double>::operator=((Vector3<double> *)&local_78,&local_108);
        StuntDouble::setVel(pSVar6,(Vector3d *)&local_78);
        if (pSVar6->objType_ - otDAtom < 2) {
          StuntDouble::getTrq((Vector3d *)&local_f0,pSVar6);
          StuntDouble::lab2Body((Vector3d *)&local_108,pSVar6,(Vector3d *)&local_f0);
          Vector<double,_3U>::operator=(&local_48,&local_108);
          lVar3 = local_148;
          pVVar4 = (Vector<double,_3U> *)
                   ((long)(((this->oldJi_).
                            super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->super_Vector<double,_3U>).
                          data_ + local_148);
          operator*(&local_a8,
                    (this->super_VelocityVerletIntegrator).super_Integrator.dt2 * 0.0004184,
                    &local_48);
          OpenMD::operator+(&local_f0,pVVar4,&local_a8);
          operator*(&local_c0,
                    (this->super_VelocityVerletIntegrator).super_Integrator.dt2 * local_158.first,
                    (Vector<double,_3U> *)
                    ((long)(((this->oldJi_).
                             super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)->super_Vector<double,_3U>).
                           data_ + lVar3));
          operator-(&local_108,&local_f0,&local_c0);
          Vector3<double>::operator=((Vector3<double> *)&local_60,&local_108);
          StuntDouble::setJ(pSVar6,(Vector3d *)&local_60);
        }
        if (local_118 ==
            (local_120->integrableObjects_).
            super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>.
            _M_impl.super__Vector_impl_data._M_finish) {
          pSVar6 = (StuntDouble *)0x0;
        }
        else {
          pSVar6 = *local_118;
        }
        local_148 = local_148 + 0x18;
        lVar3 = local_110 + 1;
        ppSVar7 = local_118;
      }
      pMVar1 = SimInfo::nextMolecule
                         ((this->super_VelocityVerletIntegrator).super_Integrator.info_,&local_140);
    }
    Rattle::constraintB((this->super_VelocityVerletIntegrator).super_Integrator.rattle_);
    uVar2 = (ulong)((int)local_128 + 1);
    dVar9 = local_158.first;
  } while (this->chiTolerance_ < ABS(local_d8 - local_158.first));
  (*((this->super_VelocityVerletIntegrator).super_Integrator.flucQ_)->
    _vptr_FluctuatingChargePropagator[6])();
  local_158.second =
       dVar9 * (this->super_VelocityVerletIntegrator).super_Integrator.dt2 + local_158.second;
  Snapshot::setThermostat((this->super_VelocityVerletIntegrator).super_Integrator.snap,&local_158);
  return;
}

Assistant:

void NVT::moveB() {
    SimInfo::MoleculeIterator i;
    Molecule::IntegrableObjectIterator j;
    Molecule* mol;
    StuntDouble* sd;

    Vector3d Tb;
    Vector3d ji;
    Vector3d vel;
    Vector3d frc;
    RealType mass;
    RealType instTemp;
    int index;
    // Set things up for the iteration:

    pair<RealType, RealType> thermostat = snap->getThermostat();
    RealType oldChi                     = thermostat.first;
    RealType prevChi;

    index = 0;
    for (mol = info_->beginMolecule(i); mol != NULL;
         mol = info_->nextMolecule(i)) {
      for (sd = mol->beginIntegrableObject(j); sd != NULL;
           sd = mol->nextIntegrableObject(j)) {
        oldVel_[index] = sd->getVel();

        if (sd->isDirectional()) oldJi_[index] = sd->getJ();

        ++index;
      }
    }

    // do the iteration:

    for (int k = 0; k < maxIterNum_; k++) {
      index    = 0;
      instTemp = thermo.getTemperature();

      // evolve chi another half step using the temperature at t + dt/2

      prevChi          = thermostat.first;
      thermostat.first = oldChi + dt2 * (instTemp / targetTemp_ - 1.0) /
                                      (tauThermostat_ * tauThermostat_);

      for (mol = info_->beginMolecule(i); mol != NULL;
           mol = info_->nextMolecule(i)) {
        for (sd = mol->beginIntegrableObject(j); sd != NULL;
             sd = mol->nextIntegrableObject(j)) {
          frc  = sd->getFrc();
          mass = sd->getMass();

          // velocity half step

          vel = oldVel_[index] + dt2 / mass * Constants::energyConvert * frc -
                dt2 * thermostat.first * oldVel_[index];

          sd->setVel(vel);

          if (sd->isDirectional()) {
            // get and convert the torque to body frame

            Tb = sd->lab2Body(sd->getTrq());

            ji = oldJi_[index] + dt2 * Constants::energyConvert * Tb -
                 dt2 * thermostat.first * oldJi_[index];

            sd->setJ(ji);
          }

          ++index;
        }
      }

      rattle_->constraintB();

      if (fabs(prevChi - thermostat.first) <= chiTolerance_) break;
    }

    flucQ_->moveB();

    thermostat.second += dt2 * thermostat.first;
    snap->setThermostat(thermostat);
  }